

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sha256.cpp
# Opt level: O2

void Sha256::Private::Transform(UInt32 *state,UInt32 *data)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  UInt32 UVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  UInt32 aUStack_a8 [8];
  UInt32 *local_88;
  UInt32 *local_80;
  UInt32 T [8];
  UInt32 W [16];
  
  local_80 = data;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    aUStack_a8[lVar2] = state[lVar2];
  }
  local_88 = state;
  for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 0x10) {
    for (uVar7 = 0; uVar7 != 0x10; uVar7 = uVar7 + 1) {
      iVar6 = (int)uVar7;
      if (uVar3 == 0) {
        UVar4 = local_80[uVar7];
        T[uVar7] = UVar4;
      }
      else {
        uVar1 = T[iVar6 + 0xeU & 0xf];
        uVar5 = T[iVar6 + 1U & 0xf];
        UVar4 = (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
                T[iVar6 + 9U & 0xf] + T[uVar7] +
                (uVar5 >> 3 ^ (uVar5 << 0xe | uVar5 >> 0x12) ^ (uVar5 << 0x19 | uVar5 >> 7));
        T[uVar7] = UVar4;
      }
      uVar1 = aUStack_a8[4U - iVar6 & 7];
      uVar5 = 7U - iVar6 & 7;
      UVar4 = ((uVar1 << 7 | uVar1 >> 0x19) ^
              (uVar1 << 0x15 | uVar1 >> 0xb) ^ (uVar1 << 0x1a | uVar1 >> 6)) + K[uVar7 | uVar3] +
              ((aUStack_a8[5U - iVar6 & 7] ^ aUStack_a8[6U - iVar6 & 7]) & uVar1 ^
              aUStack_a8[6U - iVar6 & 7]) + UVar4 + aUStack_a8[uVar5];
      aUStack_a8[uVar5] = UVar4;
      aUStack_a8[3U - iVar6 & 7] = aUStack_a8[3U - iVar6 & 7] + UVar4;
      uVar1 = aUStack_a8[-iVar6 & 7];
      aUStack_a8[uVar5] =
           ((uVar1 << 10 | uVar1 >> 0x16) ^
           (uVar1 << 0x13 | uVar1 >> 0xd) ^ (uVar1 << 0x1e | uVar1 >> 2)) + aUStack_a8[uVar5] +
           ((aUStack_a8[1U - iVar6 & 7] | uVar1) & aUStack_a8[2U - iVar6 & 7] |
           aUStack_a8[1U - iVar6 & 7] & uVar1);
    }
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    local_88[lVar2] = local_88[lVar2] + aUStack_a8[lVar2];
  }
  return;
}

Assistant:

static void Transform(UInt32 *state, const UInt32 *data)
  {
    UInt32 W[16];
    unsigned j;
    #ifdef _SHA256_UNROLL2
    UInt32 a,b,c,d,e,f,g,h;
    a = state[0];
    b = state[1];
    c = state[2];
    d = state[3];
    e = state[4];
    f = state[5];
    g = state[6];
    h = state[7];
    #else
    UInt32 T[8];
    for (j = 0; j < 8; j++)
      T[j] = state[j];
    #endif

    for (j = 0; j < 64; j += 16)
    {
      #if defined(_SHA256_UNROLL) || defined(_SHA256_UNROLL2)
      RX_8(0); RX_8(8);
      #else
      unsigned i;
      for (i = 0; i < 16; i++) { R(i); }
      #endif
    }

    #ifdef _SHA256_UNROLL2
    state[0] += a;
    state[1] += b;
    state[2] += c;
    state[3] += d;
    state[4] += e;
    state[5] += f;
    state[6] += g;
    state[7] += h;
    #else
    for (j = 0; j < 8; j++)
      state[j] += T[j];
    #endif
  
    /* Wipe variables */
    /* memset(W, 0, sizeof(W)); */
    /* memset(T, 0, sizeof(T)); */
  }